

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

char * CVmObjString::cvt_to_str
                 (vm_val_t *new_str,char *result_buf,size_t result_buf_size,vm_val_t *val,int radix,
                 int flags)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  new_str->typ = VM_NIL;
  switch(val->typ) {
  case VM_NIL:
    pcVar2 = "\x03";
    break;
  case VM_TRUE:
    pcVar2 = "\x04";
    break;
  default:
    err_throw(0x7d1);
  case VM_OBJ:
    uVar1 = (val->val).obj;
    UNRECOVERED_JUMPTABLE =
         *(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x168);
    pcVar2 = (char *)(*UNRECOVERED_JUMPTABLE)
                               (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),uVar1,new_str,
                                radix,flags,UNRECOVERED_JUMPTABLE);
    return pcVar2;
  case VM_PROP:
    pcVar2 = reflect_to_str(new_str,result_buf,result_buf_size,val,"property#%d",
                            (ulong)(val->val).prop);
    return pcVar2;
  case VM_INT:
    pcVar2 = alloc_str_buf(new_str,result_buf,result_buf_size,0x28);
    pcVar2 = cvt_int_to_str(pcVar2,0x28,(val->val).intval,radix,flags);
    return pcVar2;
  case VM_SSTRING:
    pcVar2 = G_const_pool_X.super_CVmPoolPaged.pages_
             [(val->val).obj >> ((byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].
             mem + (G_const_pool_X.super_CVmPoolPaged._8_4_ - 1 & (val->val).obj);
    break;
  case VM_LIST:
    pcVar2 = CVmObjList::list_to_string(new_str,val,radix,flags);
    return pcVar2;
  case VM_FUNCPTR:
    uVar1 = (val->val).obj;
    pcVar2 = "function#%lx";
    goto LAB_002b79ae;
  case VM_ENUM:
    uVar1 = (val->val).obj;
    pcVar2 = "enum#%ld";
LAB_002b79ae:
    pcVar2 = reflect_to_str(new_str,result_buf,result_buf_size,val,pcVar2,(ulong)uVar1);
    return pcVar2;
  case VM_BIFPTR:
    pcVar2 = reflect_to_str(new_str,result_buf,result_buf_size,val,"builtin#%d.%d",
                            (ulong)(val->val).prop,(uint)(val->val).bifptr.func_idx);
  }
  return pcVar2;
}

Assistant:

const char *CVmObjString::cvt_to_str(VMG_ vm_val_t *new_str,
                                     char *result_buf,
                                     size_t result_buf_size,
                                     const vm_val_t *val,
                                     int radix, int flags)
{
    /* presume we won't need to create a new string object */
    new_str->set_nil();
    
    /* check the type of the value */
    switch(val->typ)
    {
    case VM_SSTRING:
        /* it's a string constant - no conversion is necessary */
        return G_const_pool->get_ptr(val->val.ofs);

    case VM_OBJ:
        /* it's an object - ask it for its string representation */
        return vm_objp(vmg_ val->val.obj)->explicit_to_string(
            vmg_ val->val.obj, new_str, radix, flags);

    case VM_INT:
        /* 
         *   It's a number - convert it to a string.  Use the provided result
         *   buffer if possible, but make sure we have room for the number.
         *   The unicode values we're storing are in the ascii range, so we
         *   only need one byte per character.  The longest buffer we'd need,
         *   then, is 33 bytes, for a conversion to a bit string (i.e., base
         *   2: 32 1s or 0s, plus a sign).  The conversion also needs two
         *   bytes for the length prefix; add a few extra bytes as insurance
         *   against future algorithm changes that might need more padding.  
         */
        result_buf = alloc_str_buf(vmg_ new_str,
                                   result_buf, result_buf_size, 40);

        /* generate the string */
        return cvt_int_to_str(result_buf, 40, val->val.intval, radix, flags);

    case VM_NIL:
        /* nil - use the literal string "nil" */
        return "\003\000nil";

    case VM_TRUE:
        /* true - use the literal string "true" */
        return "\004\000true";

    case VM_LIST:
        return CVmObjList::list_to_string(vmg_ new_str, val, radix, flags);

    case VM_PROP:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "property#%d", (int)val->val.prop);

    case VM_FUNCPTR:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "function#%lx", (long)val->val.ofs);

    case VM_ENUM:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "enum#%ld", (long)val->val.enumval);

    case VM_BIFPTR:
        return reflect_to_str(vmg_ new_str, result_buf, result_buf_size, val,
                              "builtin#%d.%d",
                              (int)val->val.bifptr.set_idx,
                              (int)val->val.bifptr.func_idx);

    default:
        /* other types cannot be added to a string */
        err_throw(VMERR_NO_STR_CONV);

        /* we never really get here, but the compiler doesn't know that */
        AFTER_ERR_THROW(return 0;)
    }
}